

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# censor2.c
# Opt level: O3

int ssh2_censor_packet(PacketLogSettings *pls,int type,_Bool sender_is_client,ptrlen pkt,
                      logblank_t *blanks)

{
  logblank_t *plVar1;
  BinarySource *pBVar2;
  _Bool _Var3;
  uint uVar4;
  long lVar5;
  ptrlen pVar6;
  BinarySource src [1];
  BinarySource local_58;
  
  local_58.len = pkt.len;
  local_58.data = pkt.ptr;
  local_58.binarysource_ = &local_58;
  local_58.pos = 0;
  local_58.err = BSE_NO_ERROR;
  lVar5 = 0;
  pBVar2 = &local_58;
  if (((type & 0xfffffffeU) == 0x5e) && (pBVar2 = &local_58, pls->omit_data != false)) {
    BinarySource_get_uint32(&local_58);
    if (type == 0x5f) {
      BinarySource_get_uint32(local_58.binarysource_);
    }
    pVar6 = BinarySource_get_string(local_58.binarysource_);
    pBVar2 = local_58.binarysource_;
    if ((local_58.binarysource_)->err == BSE_NO_ERROR) {
      blanks->offset = (int)local_58.pos - (int)pVar6.len;
      blanks->type = 2;
      blanks->len = (int)pVar6.len;
      lVar5 = 1;
    }
  }
  local_58.binarysource_ = pBVar2;
  uVar4 = (uint)lVar5;
  if ((sender_is_client) && (pls->omit_passwords == true)) {
    if (type == 0x32) {
      BinarySource_get_string(local_58.binarysource_);
      BinarySource_get_string(local_58.binarysource_);
      pVar6 = BinarySource_get_string(local_58.binarysource_);
      _Var3 = ptrlen_eq_string(pVar6,"password");
      if (_Var3) {
        BinarySource_get_bool(local_58.binarysource_);
        pVar6 = BinarySource_get_string(local_58.binarysource_);
        if ((local_58.binarysource_)->err == BSE_NO_ERROR) {
          blanks[lVar5].offset = (int)local_58.pos - (int)pVar6.len;
          blanks[lVar5].type = 1;
          blanks[lVar5].len = (int)pVar6.len;
          uVar4 = uVar4 + 1;
          BinarySource_get_string(local_58.binarysource_);
          if ((local_58.binarysource_)->err == BSE_NO_ERROR) {
            blanks[lVar5].len = (int)local_58.pos - blanks[uVar4].offset;
          }
        }
      }
    }
    else {
      if ((type == 0x3d) && (pls->actx == SSH2_PKTCTX_KBDINTER)) {
        BinarySource_get_uint32(local_58.binarysource_);
        plVar1 = blanks + lVar5;
        plVar1->offset = (int)local_58.pos;
        plVar1->type = 1;
        do {
          BinarySource_get_string(local_58.binarysource_);
        } while ((local_58.binarysource_)->err == BSE_NO_ERROR);
        plVar1->len = (int)local_58.pos - plVar1->offset;
      }
      else {
        if (type != 0x62) {
          return uVar4;
        }
        BinarySource_get_uint32(local_58.binarysource_);
        pVar6 = BinarySource_get_string(local_58.binarysource_);
        _Var3 = ptrlen_eq_string(pVar6,"x11-req");
        if (!_Var3) {
          return uVar4;
        }
        BinarySource_get_bool(local_58.binarysource_);
        BinarySource_get_bool(local_58.binarysource_);
        BinarySource_get_string(local_58.binarysource_);
        pVar6 = BinarySource_get_string(local_58.binarysource_);
        if ((local_58.binarysource_)->err != BSE_NO_ERROR) {
          return uVar4;
        }
        blanks[lVar5].offset = (int)local_58.pos - (int)pVar6.len;
        blanks[lVar5].type = 1;
        blanks[lVar5].len = (int)pVar6.len;
      }
      uVar4 = uVar4 + 1;
    }
  }
  return uVar4;
}

Assistant:

int ssh2_censor_packet(
    const PacketLogSettings *pls, int type, bool sender_is_client,
    ptrlen pkt, logblank_t *blanks)
{
    int nblanks = 0;
    ptrlen str;
    BinarySource src[1];

    BinarySource_BARE_INIT_PL(src, pkt);

    if (pls->omit_data &&
        (type == SSH2_MSG_CHANNEL_DATA ||
         type == SSH2_MSG_CHANNEL_EXTENDED_DATA)) {
        /* "Session data" packets - omit the data string. */
        get_uint32(src);              /* skip channel id */
        if (type == SSH2_MSG_CHANNEL_EXTENDED_DATA)
            get_uint32(src);          /* skip extended data type */
        str = get_string(src);
        if (!get_err(src)) {
            assert(nblanks < MAX_BLANKS);
            blanks[nblanks].offset = src->pos - str.len;
            blanks[nblanks].type = PKTLOG_OMIT;
            blanks[nblanks].len = str.len;
            nblanks++;
        }
    }

    if (sender_is_client && pls->omit_passwords) {
        if (type == SSH2_MSG_USERAUTH_REQUEST) {
            /* If this is a password packet, blank the password(s). */
            get_string(src);              /* username */
            get_string(src);              /* service name */
            str = get_string(src);        /* auth method */
            if (ptrlen_eq_string(str, "password")) {
                get_bool(src);
                /* Blank the password field. */
                str = get_string(src);
                if (!get_err(src)) {
                    assert(nblanks < MAX_BLANKS);
                    blanks[nblanks].offset = src->pos - str.len;
                    blanks[nblanks].type = PKTLOG_BLANK;
                    blanks[nblanks].len = str.len;
                    nblanks++;
                    /* If there's another password field beyond it
                     * (change of password), blank that too. */
                    str = get_string(src);
                    if (!get_err(src))
                        blanks[nblanks-1].len =
                            src->pos - blanks[nblanks].offset;
                }
            }
        } else if (pls->actx == SSH2_PKTCTX_KBDINTER &&
                   type == SSH2_MSG_USERAUTH_INFO_RESPONSE) {
            /* If this is a keyboard-interactive response packet,
             * blank the responses. */
            get_uint32(src);
            assert(nblanks < MAX_BLANKS);
            blanks[nblanks].offset = src->pos;
            blanks[nblanks].type = PKTLOG_BLANK;
            do {
                str = get_string(src);
            } while (!get_err(src));
            blanks[nblanks].len = src->pos - blanks[nblanks].offset;
            nblanks++;
        } else if (type == SSH2_MSG_CHANNEL_REQUEST) {
            /*
             * If this is an X forwarding request packet, blank the
             * fake auth data.
             *
             * Note that while we blank the X authentication data
             * here, we don't take any special action to blank the
             * start of an X11 channel, so using MIT-MAGIC-COOKIE-1
             * and actually opening an X connection without having
             * session blanking enabled is likely to leak your cookie
             * into the log.
             */
            get_uint32(src);
            str = get_string(src);
            if (ptrlen_eq_string(str, "x11-req")) {
                get_bool(src);
                get_bool(src);
                get_string(src);
                str = get_string(src);
                if (!get_err(src)) {
                    assert(nblanks < MAX_BLANKS);
                    blanks[nblanks].offset = src->pos - str.len;
                    blanks[nblanks].type = PKTLOG_BLANK;
                    blanks[nblanks].len = str.len;
                    nblanks++;
                }
            }
        }
    }

    return nblanks;
}